

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O1

DecodePsbtUtxoStruct * __thiscall
cfd::api::json::DecodePsbtUtxo::ConvertToStruct
          (DecodePsbtUtxoStruct *__return_storage_ptr__,DecodePsbtUtxo *this)

{
  _Rb_tree_header *p_Var1;
  undefined1 local_d0 [32];
  _Alloc_hider local_b0;
  char local_a0 [16];
  _Alloc_hider local_90;
  char local_80 [16];
  _Alloc_hider local_70;
  char local_60 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  
  __return_storage_ptr__->amount = 0;
  DecodePsbtLockingScriptStruct::DecodePsbtLockingScriptStruct
            (&__return_storage_ptr__->script_pub_key);
  p_Var1 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __return_storage_ptr__->amount = this->amount_;
  DecodePsbtLockingScript::ConvertToStruct
            ((DecodePsbtLockingScriptStruct *)local_d0,&this->script_pub_key_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->script_pub_key,(string *)local_d0);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->script_pub_key).hex,(string *)&local_b0);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->script_pub_key).type,(string *)&local_90);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->script_pub_key).address,(string *)&local_70);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->script_pub_key).ignore_items._M_t);
  if (local_50._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_50._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->script_pub_key).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_color = local_50._M_impl.super__Rb_tree_header._M_header._M_color;
    (__return_storage_ptr__->script_pub_key).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_parent = local_50._M_impl.super__Rb_tree_header._M_header._M_parent;
    (__return_storage_ptr__->script_pub_key).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_left = local_50._M_impl.super__Rb_tree_header._M_header._M_left;
    (__return_storage_ptr__->script_pub_key).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_right = local_50._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_50._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &(__return_storage_ptr__->script_pub_key).ignore_items._M_t._M_impl.super__Rb_tree_header.
          _M_header;
    (__return_storage_ptr__->script_pub_key).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = local_50._M_impl.super__Rb_tree_header._M_node_count;
    local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_50._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_50._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_50);
  if (local_70._M_p != local_60) {
    operator_delete(local_70._M_p);
  }
  if (local_90._M_p != local_80) {
    operator_delete(local_90._M_p);
  }
  if (local_b0._M_p != local_a0) {
    operator_delete(local_b0._M_p);
  }
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

DecodePsbtUtxoStruct DecodePsbtUtxo::ConvertToStruct() const {  // NOLINT
  DecodePsbtUtxoStruct result;
  result.amount = amount_;
  result.script_pub_key = script_pub_key_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}